

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManChoiceLevel_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int local_3c;
  int LevelMax;
  int nTerms;
  int iTerm1;
  int iBox;
  int i;
  Gia_Obj_t *pNext;
  Tim_Man_t *pManTime;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  local_3c = 0;
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pObj);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsConst0(pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                          ,0x2c1,"void Gia_ManChoiceLevel_rec(Gia_Man_t *, Gia_Obj_t *)");
          }
        }
        else {
          pGVar4 = Gia_ObjFanin0(pObj);
          Gia_ManChoiceLevel_rec(p,pGVar4);
          iVar1 = Gia_ObjLevel(p,pGVar4);
          if (0 < iVar1) {
            local_3c = Gia_ObjLevel(p,pGVar4);
          }
          pGVar4 = Gia_ObjFanin1(pObj);
          Gia_ManChoiceLevel_rec(p,pGVar4);
          iVar1 = Gia_ObjLevel(p,pGVar4);
          if (local_3c < iVar1) {
            local_3c = Gia_ObjLevel(p,pGVar4);
          }
          local_3c = local_3c + 1;
          iVar1 = Gia_ObjId(p,pObj);
          pGVar4 = Gia_ObjSiblObj(p,iVar1);
          if (pGVar4 != (Gia_Obj_t *)0x0) {
            Gia_ManChoiceLevel_rec(p,pGVar4);
            iVar1 = Gia_ObjLevel(p,pGVar4);
            if (local_3c < iVar1) {
              local_3c = Gia_ObjLevel(p,pGVar4);
            }
          }
        }
      }
      else {
        pGVar4 = Gia_ObjFanin0(pObj);
        Gia_ManChoiceLevel_rec(p,pGVar4);
        iVar1 = Gia_ObjLevel(p,pGVar4);
        if (0 < iVar1) {
          local_3c = Gia_ObjLevel(p,pGVar4);
        }
      }
    }
    else if (p_00 != (Tim_Man_t *)0x0) {
      iVar1 = Gia_ObjCioId(pObj);
      iVar1 = Tim_ManBoxForCi(p_00,iVar1);
      if (-1 < iVar1) {
        iVar2 = Tim_ManBoxInputFirst(p_00,iVar1);
        iVar1 = Tim_ManBoxInputNum(p_00,iVar1);
        for (iTerm1 = 0; iTerm1 < iVar1; iTerm1 = iTerm1 + 1) {
          pGVar4 = Gia_ManCo(p,iVar2 + iTerm1);
          Gia_ManChoiceLevel_rec(p,pGVar4);
          iVar3 = Gia_ObjLevel(p,pGVar4);
          if (local_3c < iVar3) {
            local_3c = Gia_ObjLevel(p,pGVar4);
          }
        }
        local_3c = local_3c + 1;
      }
    }
    Gia_ObjSetLevel(p,pObj,local_3c);
  }
  return;
}

Assistant:

void Gia_ManChoiceLevel_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms, LevelMax = 0;
    if ( Gia_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Gia_ObjSetTravIdCurrent( p, pObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        if ( pManTime )
        {
            iBox = Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) );
            if ( iBox >= 0 ) // this is not a true PI
            {
                iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Gia_ManCo( p, iTerm1 + i );
                    Gia_ManChoiceLevel_rec( p, pNext );
                    if ( LevelMax < Gia_ObjLevel(p, pNext) )
                        LevelMax = Gia_ObjLevel(p, pNext);
                }
                LevelMax++;
            }
        }
//        Abc_Print( 1, "%d ", pObj->Level );
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        pNext = Gia_ObjFanin0(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
    }
    else if ( Gia_ObjIsAnd(pObj) )
    { 
        // get the maximum level of the two fanins
        pNext = Gia_ObjFanin0(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
        pNext = Gia_ObjFanin1(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
        LevelMax++;

        // get the level of the nodes in the choice node
        if ( (pNext = Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))) )
        {
            Gia_ManChoiceLevel_rec( p, pNext );
            if ( LevelMax < Gia_ObjLevel(p, pNext) )
                LevelMax = Gia_ObjLevel(p, pNext);
        }
    }
    else if ( !Gia_ObjIsConst0(pObj) )
        assert( 0 );
    Gia_ObjSetLevel( p, pObj, LevelMax );
}